

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

void __thiscall dynamicgraph::SignalBase<int>::unplug(SignalBase<int> *this)

{
  ExceptionSignal *this_00;
  allocator<char> local_3d;
  ErrorCodeEnum local_3c;
  string local_38 [32];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_3c = PLUG_IMPOSSIBLE;
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Plug-in operation not possible with this signal. ",&local_3d);
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_3c,local_38,"(while trying to unplug %s).",(this->name)._M_dataplus._M_p
            );
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual void unplug() {
    DG_THROW ExceptionSignal(
        ExceptionSignal::PLUG_IMPOSSIBLE,
        "Plug-in operation not possible with this signal. ",
        "(while trying to unplug %s).", this->getName().c_str());
  }